

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall TypeTest_CanonicalizeUses_Test::TestBody(TypeTest_CanonicalizeUses_Test *this)

{
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  char *pcVar1;
  char *in_R9;
  pointer *__ptr;
  initializer_list<unsigned_long> indices;
  initializer_list<unsigned_long> indices_00;
  initializer_list<unsigned_long> indices_01;
  initializer_list<unsigned_long> indices_02;
  initializer_list<unsigned_long> indices_03;
  initializer_list<unsigned_long> indices_04;
  undefined1 local_80 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  _Variadic_union<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  local_60;
  byte local_48;
  TypeBuilder local_40;
  TypeBuilder builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  AssertHelper local_20;
  
  ::wasm::TypeBuilder::TypeBuilder(&local_40,8);
  TypeTest::makeStruct
            ((Struct *)&local_60._M_first,&this->super_TypeTest,&local_40,
             (initializer_list<unsigned_long>)ZEXT816(0));
  ::wasm::TypeBuilder::setHeapType((ulong)&local_40,(Struct *)0x0);
  if ((void *)local_60._0_8_ != (void *)0x0) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ - local_60._0_8_);
  }
  TypeTest::makeStruct
            ((Struct *)&local_60._M_first,&this->super_TypeTest,&local_40,
             (initializer_list<unsigned_long>)ZEXT816(0));
  ::wasm::TypeBuilder::setHeapType((ulong)&local_40,(Struct *)0x1);
  if ((void *)local_60._0_8_ != (void *)0x0) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ - local_60._0_8_);
  }
  local_80 = (undefined1  [8])0x0;
  indices._M_len = 1;
  indices._M_array = (iterator)local_80;
  TypeTest::makeStruct((Struct *)&local_60._M_first,&this->super_TypeTest,&local_40,indices);
  ::wasm::TypeBuilder::setHeapType((ulong)&local_40,(Struct *)0x2);
  if ((void *)local_60._0_8_ != (void *)0x0) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ - local_60._0_8_);
  }
  local_80 = (undefined1  [8])0x1;
  indices_00._M_len = 1;
  indices_00._M_array = (iterator)local_80;
  TypeTest::makeStruct((Struct *)&local_60._M_first,&this->super_TypeTest,&local_40,indices_00);
  ::wasm::TypeBuilder::setHeapType((ulong)&local_40,(Struct *)0x3);
  if ((void *)local_60._0_8_ != (void *)0x0) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ - local_60._0_8_);
  }
  local_80 = (undefined1  [8])0x0;
  built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  indices_01._M_len = 2;
  indices_01._M_array = (iterator)local_80;
  TypeTest::makeStruct((Struct *)&local_60._M_first,&this->super_TypeTest,&local_40,indices_01);
  ::wasm::TypeBuilder::setHeapType((ulong)&local_40,(Struct *)0x4);
  if ((void *)local_60._0_8_ != (void *)0x0) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ - local_60._0_8_);
  }
  local_80 = (undefined1  [8])0x1;
  built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  indices_02._M_len = 2;
  indices_02._M_array = (iterator)local_80;
  TypeTest::makeStruct((Struct *)&local_60._M_first,&this->super_TypeTest,&local_40,indices_02);
  ::wasm::TypeBuilder::setHeapType((ulong)&local_40,(Struct *)&DAT_00000005);
  if ((void *)local_60._0_8_ != (void *)0x0) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ - local_60._0_8_);
  }
  local_80 = (undefined1  [8])0x2;
  built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4;
  indices_03._M_len = 2;
  indices_03._M_array = (iterator)local_80;
  TypeTest::makeStruct((Struct *)&local_60._M_first,&this->super_TypeTest,&local_40,indices_03);
  ::wasm::TypeBuilder::setHeapType((ulong)&local_40,(Struct *)&DAT_00000006);
  if ((void *)local_60._0_8_ != (void *)0x0) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ - local_60._0_8_);
  }
  local_80 = (undefined1  [8])0x3;
  built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_00000005;
  indices_04._M_len = 2;
  indices_04._M_array = (iterator)local_80;
  TypeTest::makeStruct((Struct *)&local_60._M_first,&this->super_TypeTest,&local_40,indices_04);
  ::wasm::TypeBuilder::setHeapType((ulong)&local_40,(Struct *)0x7);
  if ((void *)local_60._0_8_ != (void *)0x0) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ - local_60._0_8_);
  }
  ::wasm::TypeBuilder::build();
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_1_ = local_48 == 0;
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)(char)builder.impl._M_t.
                  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                  .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl) {
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)&local_60._M_first);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_80,__x);
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              ((internal *)&builder,"built[0]","built[1]",(HeapType *)local_80,
               (HeapType *)((long)local_80 + 8));
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_28);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1a2,pcVar1);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              ((internal *)&builder,"built[2]","built[3]",(HeapType *)((long)local_80 + 0x10),
               (HeapType *)((long)local_80 + 0x18));
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_28);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1a3,pcVar1);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              ((internal *)&builder,"built[4]","built[5]",(HeapType *)((long)local_80 + 0x20),
               (HeapType *)((long)local_80 + 0x28));
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_28);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1a4,pcVar1);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              ((internal *)&builder,"built[6]","built[7]",(HeapType *)((long)local_80 + 0x30),
               (HeapType *)((long)local_80 + 0x38));
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_28);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1a5,pcVar1);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)&builder,"built[0]","built[2]",(HeapType *)local_80,
               (HeapType *)((long)local_80 + 0x10));
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_28);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1a7,pcVar1);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)&builder,"built[0]","built[4]",(HeapType *)local_80,
               (HeapType *)((long)local_80 + 0x20));
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_28);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1a8,pcVar1);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)&builder,"built[0]","built[6]",(HeapType *)local_80,
               (HeapType *)((long)local_80 + 0x30));
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_28);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1a9,pcVar1);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)&builder,"built[2]","built[4]",(HeapType *)((long)local_80 + 0x10),
               (HeapType *)((long)local_80 + 0x20));
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_28);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1aa,pcVar1);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)&builder,"built[2]","built[6]",(HeapType *)((long)local_80 + 0x10),
               (HeapType *)((long)local_80 + 0x30));
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_28);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1ab,pcVar1);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)&builder,"built[4]","built[6]",(HeapType *)((long)local_80 + 0x20),
               (HeapType *)((long)local_80 + 0x30));
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_28);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x1ac,pcVar1);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    if (local_80 != (undefined1  [8])0x0) {
      operator_delete((void *)local_80,
                      (long)built.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_80);
    }
  }
  else {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)&builder,(AssertionResult *)"result","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x19f,(char *)local_80);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_80 !=
        (undefined1  [8])
        &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      operator_delete((void *)local_80,
                      (ulong)((long)&(built.
                                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
    }
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_48]._M_data)
            ((anon_class_1_0_00000001 *)local_80,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)&local_60._M_first);
  ::wasm::TypeBuilder::~TypeBuilder(&local_40);
  return;
}

Assistant:

TEST_F(TypeTest, CanonicalizeUses) {
  TypeBuilder builder(8);
  builder[0] = makeStruct(builder, {});
  builder[1] = makeStruct(builder, {});
  builder[2] = makeStruct(builder, {0});
  builder[3] = makeStruct(builder, {1});
  builder[4] = makeStruct(builder, {0, 2});
  builder[5] = makeStruct(builder, {1, 3});
  builder[6] = makeStruct(builder, {2, 4});
  builder[7] = makeStruct(builder, {3, 5});

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_EQ(built[0], built[1]);
  EXPECT_EQ(built[2], built[3]);
  EXPECT_EQ(built[4], built[5]);
  EXPECT_EQ(built[6], built[7]);

  EXPECT_NE(built[0], built[2]);
  EXPECT_NE(built[0], built[4]);
  EXPECT_NE(built[0], built[6]);
  EXPECT_NE(built[2], built[4]);
  EXPECT_NE(built[2], built[6]);
  EXPECT_NE(built[4], built[6]);
}